

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O1

int CfdGetTxInIssuanceInfo
              (void *handle,char *tx_hex_string,uint32_t index,char **entropy,char **nonce,
              int64_t *asset_amount,char **asset_value,int64_t *token_amount,char **token_value,
              char **asset_rangeproof,char **token_rangeproof)

{
  bool bVar1;
  ConfidentialTransaction *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int64_t iVar3;
  pointer puVar4;
  CfdException *this_00;
  ulong uVar5;
  size_t sVar6;
  Amount AVar7;
  char *work_token_value;
  char *work_asset_value;
  char *work_nonce;
  char *work_entropy;
  ConfidentialTxInReference ref;
  ConfidentialTransactionController ctxc;
  undefined1 local_2a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  ByteData local_258;
  ConfidentialValue local_238;
  void *local_210;
  ConfidentialValue local_208;
  ConfidentialTxInReference local_1e0;
  ConfidentialTransactionController local_80;
  
  local_260 = (char *)0x0;
  local_268 = (char *)0x0;
  local_270 = (char *)0x0;
  local_278 = (char *)0x0;
  local_280 = (char *)0x0;
  local_288 = (char *)0x0;
  local_210 = handle;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    local_1e0.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x5f3c92;
    local_1e0.super_AbstractTxInReference.txid_._vptr_Txid._0_4_ = 0x259;
    local_1e0.super_AbstractTxInReference.txid_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "CfdGetTxInIssuanceInfo";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_1e0,kCfdLogLevelWarning,"tx is null or empty.");
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1e0.super_AbstractTxInReference._vptr_AbstractTxInReference =
         (_func_int **)&local_1e0.super_AbstractTxInReference.txid_.data_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e0,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&local_1e0);
    __cxa_throw(this_00,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)&local_1e0,tx_hex_string,(allocator *)&local_208);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController
            (&local_80,(string *)&local_1e0);
  if ((ByteData *)local_1e0.super_AbstractTxInReference._vptr_AbstractTxInReference !=
      &local_1e0.super_AbstractTxInReference.txid_.data_) {
    operator_delete(local_1e0.super_AbstractTxInReference._vptr_AbstractTxInReference);
  }
  this = cfd::ConfidentialTransactionController::GetTransaction(&local_80);
  cfd::core::ConfidentialTransaction::GetTxIn(&local_1e0,this,index);
  if (entropy != (char **)0x0) {
    local_2a8 = (undefined1  [8])0x0;
    paStack_2a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
    local_298._M_allocated_capacity = 0;
    uVar5 = (long)local_1e0.asset_entropy_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1e0.asset_entropy_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar5 == 0) {
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
    }
    else {
      if ((long)uVar5 < 0) {
        std::__throw_bad_alloc();
      }
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)operator_new(uVar5);
    }
    local_298._M_allocated_capacity = (size_type)(paVar2->_M_local_buf + uVar5);
    sVar6 = (long)local_1e0.asset_entropy_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1e0.asset_entropy_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_2a8 = (undefined1  [8])paVar2;
    if (sVar6 != 0) {
      paStack_2a0 = paVar2;
      memmove(paVar2,local_1e0.asset_entropy_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar6);
    }
    paStack_2a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar2->_M_local_buf + sVar6);
    cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_238,(ByteData256 *)local_2a8);
    cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&local_208,(BlindFactor *)&local_238);
    local_260 = cfd::capi::CreateString((string *)&local_208);
    if (local_208._vptr_ConfidentialValue !=
        (_func_int **)
        ((long)&local_208.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data + 8U)) {
      operator_delete(local_208._vptr_ConfidentialValue);
    }
    local_238._vptr_ConfidentialValue = (_func_int **)&PTR__BlindFactor_007354b0;
    if (local_238.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_2a8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_2a8);
    }
  }
  if (nonce != (char **)0x0) {
    local_2a8 = (undefined1  [8])0x0;
    paStack_2a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
    local_298._M_allocated_capacity = 0;
    uVar5 = (long)local_1e0.blinding_nonce_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1e0.blinding_nonce_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar5 == 0) {
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
    }
    else {
      if ((long)uVar5 < 0) {
        std::__throw_bad_alloc();
      }
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)operator_new(uVar5);
    }
    local_298._M_allocated_capacity = (size_type)(paVar2->_M_local_buf + uVar5);
    sVar6 = (long)local_1e0.blinding_nonce_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1e0.blinding_nonce_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_2a8 = (undefined1  [8])paVar2;
    if (sVar6 != 0) {
      paStack_2a0 = paVar2;
      memmove(paVar2,local_1e0.blinding_nonce_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar6);
    }
    paStack_2a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar2->_M_local_buf + sVar6);
    cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_238,(ByteData256 *)local_2a8);
    cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&local_208,(BlindFactor *)&local_238);
    local_268 = cfd::capi::CreateString((string *)&local_208);
    if (local_208._vptr_ConfidentialValue !=
        (_func_int **)
        ((long)&local_208.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data + 8U)) {
      operator_delete(local_208._vptr_ConfidentialValue);
    }
    local_238._vptr_ConfidentialValue = (_func_int **)&PTR__BlindFactor_007354b0;
    if (local_238.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_2a8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_2a8);
    }
  }
  cfd::core::ConfidentialValue::ConfidentialValue(&local_208,&local_1e0.issuance_amount_);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_238,&local_1e0.inflation_keys_);
  if (asset_amount != (int64_t *)0x0) {
    bVar1 = cfd::core::ConfidentialValue::HasBlinding(&local_208);
    if (!bVar1) {
      bVar1 = cfd::core::ConfidentialValue::HasBlinding(&local_208);
      if (bVar1) {
        iVar3 = 0;
      }
      else {
        AVar7 = cfd::core::ConfidentialValue::GetAmount(&local_208);
        local_2a8 = (undefined1  [8])AVar7.amount_;
        paStack_2a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(paStack_2a0._1_7_,AVar7.ignore_check_);
        iVar3 = cfd::core::Amount::GetSatoshiValue((Amount *)local_2a8);
      }
      *asset_amount = iVar3;
    }
  }
  if (asset_value != (char **)0x0) {
    cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_2a8,&local_208);
    local_270 = cfd::capi::CreateString((string *)local_2a8);
    if (local_2a8 != (undefined1  [8])&local_298) {
      operator_delete((void *)local_2a8);
    }
  }
  if (token_amount != (int64_t *)0x0) {
    bVar1 = cfd::core::ConfidentialValue::HasBlinding(&local_238);
    if (!bVar1) {
      bVar1 = cfd::core::ConfidentialValue::HasBlinding(&local_238);
      if (bVar1) {
        iVar3 = 0;
      }
      else {
        AVar7 = cfd::core::ConfidentialValue::GetAmount(&local_238);
        local_2a8 = (undefined1  [8])AVar7.amount_;
        paStack_2a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(paStack_2a0._1_7_,AVar7.ignore_check_);
        iVar3 = cfd::core::Amount::GetSatoshiValue((Amount *)local_2a8);
      }
      *token_amount = iVar3;
    }
  }
  if (token_value != (char **)0x0) {
    cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_2a8,&local_238);
    local_278 = cfd::capi::CreateString((string *)local_2a8);
    if (local_2a8 != (undefined1  [8])&local_298) {
      operator_delete((void *)local_2a8);
    }
  }
  if (asset_rangeproof != (char **)0x0) {
    local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar5 = (long)local_1e0.issuance_amount_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1e0.issuance_amount_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar5 == 0) {
      puVar4 = (pointer)0x0;
    }
    else {
      if ((long)uVar5 < 0) {
        std::__throw_bad_alloc();
      }
      puVar4 = (pointer)operator_new(uVar5);
    }
    local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar4 + uVar5;
    sVar6 = (long)local_1e0.issuance_amount_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1e0.issuance_amount_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar4;
    if (sVar6 != 0) {
      local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar4;
      memmove(puVar4,local_1e0.issuance_amount_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar6);
    }
    local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4 + sVar6;
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_2a8,&local_258);
    local_280 = cfd::capi::CreateString((string *)local_2a8);
    if (local_2a8 != (undefined1  [8])&local_298) {
      operator_delete((void *)local_2a8);
    }
    if (local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_258.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (token_rangeproof != (char **)0x0) {
    local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar5 = (long)local_1e0.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1e0.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar5 == 0) {
      puVar4 = (pointer)0x0;
    }
    else {
      if ((long)uVar5 < 0) {
        std::__throw_bad_alloc();
      }
      puVar4 = (pointer)operator_new(uVar5);
    }
    local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar4 + uVar5;
    sVar6 = (long)local_1e0.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1e0.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar4;
    if (sVar6 != 0) {
      local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar4;
      memmove(puVar4,local_1e0.inflation_keys_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar6);
    }
    local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4 + sVar6;
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_2a8,&local_258);
    local_288 = cfd::capi::CreateString((string *)local_2a8);
    if (local_2a8 != (undefined1  [8])&local_298) {
      operator_delete((void *)local_2a8);
    }
    if (local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_258.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (local_260 != (char *)0x0) {
    *entropy = local_260;
  }
  if (local_268 != (char *)0x0) {
    *nonce = local_268;
  }
  if (local_270 != (char *)0x0) {
    *asset_value = local_270;
  }
  if (local_278 != (char *)0x0) {
    *token_value = local_278;
  }
  if (local_280 != (char *)0x0) {
    *asset_rangeproof = local_280;
  }
  if (local_288 != (char *)0x0) {
    *token_rangeproof = local_288;
  }
  local_238._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007357f0;
  if (local_238.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_208._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007357f0;
  if (local_208.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_1e0);
  local_80.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)&PTR__ConfidentialTransactionController_00735388;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_80.transaction_);
  return 0;
}

Assistant:

int CfdGetTxInIssuanceInfo(
    void* handle, const char* tx_hex_string, uint32_t index, char** entropy,
    char** nonce, int64_t* asset_amount, char** asset_value,
    int64_t* token_amount, char** token_value, char** asset_rangeproof,
    char** token_rangeproof) {
  char* work_entropy = nullptr;
  char* work_nonce = nullptr;
  char* work_asset_value = nullptr;
  char* work_token_value = nullptr;
  char* work_asset_rangeproof = nullptr;
  char* work_token_rangeproof = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionController ctxc(tx_hex_string);
    const ConfidentialTransaction& tx = ctxc.GetTransaction();
    const ConfidentialTxInReference ref = tx.GetTxIn(index);

    if (entropy != nullptr) {
      work_entropy = CreateString(BlindFactor(ref.GetAssetEntropy()).GetHex());
    }
    if (nonce != nullptr) {
      work_nonce = CreateString(BlindFactor(ref.GetBlindingNonce()).GetHex());
    }
    const ConfidentialValue& asset_obj = ref.GetIssuanceAmount();
    const ConfidentialValue& token_obj = ref.GetInflationKeys();
    if ((asset_amount != nullptr) && (!asset_obj.HasBlinding())) {
      *asset_amount = (asset_obj.HasBlinding())
                          ? 0
                          : asset_obj.GetAmount().GetSatoshiValue();
    }
    if (asset_value != nullptr) {
      work_asset_value = CreateString(asset_obj.GetHex());
    }
    if ((token_amount != nullptr) && (!token_obj.HasBlinding())) {
      *token_amount = (token_obj.HasBlinding())
                          ? 0
                          : token_obj.GetAmount().GetSatoshiValue();
    }
    if (token_value != nullptr) {
      work_token_value = CreateString(token_obj.GetHex());
    }
    if (asset_rangeproof != nullptr) {
      work_asset_rangeproof =
          CreateString(ref.GetIssuanceAmountRangeproof().GetHex());
    }
    if (token_rangeproof != nullptr) {
      work_token_rangeproof =
          CreateString(ref.GetInflationKeysRangeproof().GetHex());
    }

    if (work_entropy != nullptr) *entropy = work_entropy;
    if (work_nonce != nullptr) *nonce = work_nonce;
    if (work_asset_value != nullptr) *asset_value = work_asset_value;
    if (work_token_value != nullptr) *token_value = work_token_value;
    if (work_asset_rangeproof != nullptr)
      *asset_rangeproof = work_asset_rangeproof;
    if (work_token_rangeproof != nullptr)
      *token_rangeproof = work_token_rangeproof;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}